

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Plugin.cpp
# Opt level: O0

void __thiscall RenX::Plugin::~Plugin(Plugin *this)

{
  bool bVar1;
  Core *pCVar2;
  reference ppPVar3;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *this_00;
  const_iterator local_30;
  __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
  local_28;
  __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
  local_20;
  iterator itr;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *renx_plugins;
  Plugin *this_local;
  
  *(undefined ***)this = &PTR_think_001fa2f8;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_001fa7d8;
  pCVar2 = getCore();
  itr._M_current = (Plugin **)Core::getPlugins(pCVar2);
  local_20._M_current =
       (Plugin **)
       std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::begin
                 ((vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *)itr._M_current);
  do {
    local_28._M_current =
         (Plugin **)
         std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::end(itr._M_current);
    bVar1 = __gnu_cxx::
            operator==<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                      (&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0018d2a7:
      Jupiter::Plugin::~Plugin(&this->super_Plugin);
      return;
    }
    ppPVar3 = __gnu_cxx::
              __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
              ::operator*(&local_20);
    if (*ppPVar3 == this) {
      pCVar2 = getCore();
      this_00 = Core::getPlugins(pCVar2);
      __gnu_cxx::
      __normal_iterator<RenX::Plugin*const*,std::vector<RenX::Plugin*,std::allocator<RenX::Plugin*>>>
      ::__normal_iterator<RenX::Plugin**>
                ((__normal_iterator<RenX::Plugin*const*,std::vector<RenX::Plugin*,std::allocator<RenX::Plugin*>>>
                  *)&local_30,&local_20);
      std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::erase(this_00,local_30);
      goto LAB_0018d2a7;
    }
    __gnu_cxx::
    __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

RenX::Plugin::~Plugin() {
	auto& renx_plugins = RenX::getCore()->getPlugins();
	for (auto itr = renx_plugins.begin(); itr != renx_plugins.end(); ++itr) {
		if (*itr == this) {
			RenX::getCore()->getPlugins().erase(itr);
			break;
		}
	}
}